

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaFxch.c
# Opt level: O3

Fxch_Man_t * Fxch_ManStart(Vec_Wec_t *vCubes,Vec_Wec_t *vLits)

{
  int iVar1;
  Fxch_Man_t *pFVar2;
  int *piVar3;
  Fxch_Obj_t *pFVar4;
  float *pfVar5;
  Vec_Int_t *pVVar6;
  word *pwVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  size_t sVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  
  pFVar2 = (Fxch_Man_t *)calloc(1,0xe8);
  iVar9 = vCubes->nSize;
  pVVar6 = vCubes->pArray;
  (pFVar2->vCubes).nCap = vCubes->nCap;
  (pFVar2->vCubes).nSize = iVar9;
  (pFVar2->vCubes).pArray = pVVar6;
  iVar9 = vLits->nSize;
  pVVar6 = vLits->pArray;
  (pFVar2->vLits).nCap = vLits->nCap;
  (pFVar2->vLits).nSize = iVar9;
  (pFVar2->vLits).pArray = pVVar6;
  iVar9 = vLits->nSize;
  pFVar2->nVars = iVar9 / 2;
  Gia_ManRandom(1);
  iVar1 = 0;
  if (1 < iVar9) {
    uVar8 = iVar9 - (iVar9 >> 0x1f) & 0xfffffffe;
    piVar3 = (int *)malloc((ulong)uVar8 << 2);
    (pFVar2->vRands).pArray = piVar3;
    if (piVar3 == (int *)0x0) goto LAB_00358edf;
    (pFVar2->vRands).nCap = uVar8;
    iVar9 = 0;
    do {
      uVar8 = Gia_ManRandom(0);
      Vec_IntPush(&pFVar2->vRands,uVar8 & 0x3ffffff);
      iVar9 = iVar9 + 1;
    } while (iVar9 < pFVar2->nVars * 2);
    iVar1 = (pFVar2->vCubeLinks).nCap;
  }
  iVar9 = (pFVar2->vCubes).nSize;
  if (iVar1 < iVar9) {
    piVar3 = (pFVar2->vCubeLinks).pArray;
    if (piVar3 == (int *)0x0) {
      piVar3 = (int *)malloc((long)iVar9 << 2);
    }
    else {
      piVar3 = (int *)realloc(piVar3,(long)iVar9 << 2);
    }
    (pFVar2->vCubeLinks).pArray = piVar3;
    if (piVar3 == (int *)0x0) {
LAB_00358edf:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (pFVar2->vCubeLinks).nCap = iVar9;
  }
  if (0 < vCubes->nSize) {
    iVar9 = pFVar2->nLits;
    lVar13 = 4;
    lVar10 = 0;
    do {
      pVVar6 = vCubes->pArray;
      Vec_IntPush(&pFVar2->vCubeLinks,iVar9 + 1);
      iVar9 = pFVar2->nLits + *(int *)((long)&pVVar6->nCap + lVar13);
      pFVar2->nLits = iVar9;
      lVar10 = lVar10 + 1;
      lVar13 = lVar13 + 0x10;
    } while (lVar10 < vCubes->nSize);
    iVar9 = (pFVar2->vCubes).nSize;
  }
  if ((pFVar2->vCubeLinks).nSize != iVar9) {
    __assert_fail("Vec_IntSize(&p->vCubeLinks) == Vec_WecSize(&p->vCubes)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                  ,0xb8,"Fxch_Man_t *Fxch_ManStart(Vec_Wec_t *, Vec_Wec_t *)");
  }
  uVar8 = pFVar2->nLits;
  uVar12 = 0x1f;
  if (uVar8 != 0) {
    for (; uVar8 >> uVar12 == 0; uVar12 = uVar12 - 1) {
    }
  }
  uVar12 = (uVar12 ^ 0xffffffe0) + 0x21;
  if (uVar8 + 1 < 2) {
    uVar12 = uVar8 + 1;
  }
  if (0x1a < (int)uVar12) {
    __assert_fail("LogSize <= 26",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                  ,0xbb,"Fxch_Man_t *Fxch_ManStart(Vec_Wec_t *, Vec_Wec_t *)");
  }
  uVar12 = 1 << ((byte)uVar12 & 0x1f);
  iVar9 = uVar12 - 1;
  pFVar2->SizeMask = iVar9;
  pFVar4 = (Fxch_Obj_t *)calloc((ulong)uVar12,0x10);
  pFVar2->pBins = pFVar4;
  if (iVar9 <= (int)uVar8) {
    __assert_fail("p->nLits+1 < p->SizeMask+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                  ,0xbe,"Fxch_Man_t *Fxch_ManStart(Vec_Wec_t *, Vec_Wec_t *)");
  }
  iVar9 = (pFVar2->vWeights).nCap;
  if (iVar9 < 1000) {
    pfVar5 = (pFVar2->vWeights).pArray;
    if (pfVar5 == (float *)0x0) {
      pfVar5 = (float *)malloc(4000);
    }
    else {
      pfVar5 = (float *)realloc(pfVar5,4000);
    }
    (pFVar2->vWeights).pArray = pfVar5;
    (pFVar2->vWeights).nCap = 1000;
    iVar9 = 1000;
  }
  iVar1 = (pFVar2->vWeights).nSize;
  if (iVar1 == iVar9) {
    pfVar5 = (pFVar2->vWeights).pArray;
    sVar11 = (ulong)(uint)(iVar9 * 2) * 4;
    if (pfVar5 == (float *)0x0) {
      pfVar5 = (float *)malloc(sVar11);
    }
    else {
      pfVar5 = (float *)realloc(pfVar5,sVar11);
    }
    (pFVar2->vWeights).pArray = pfVar5;
    (pFVar2->vWeights).nCap = iVar9 * 2;
  }
  else {
    pfVar5 = (pFVar2->vWeights).pArray;
  }
  (pFVar2->vWeights).nSize = iVar1 + 1;
  pfVar5[iVar1] = -1.0;
  iVar9 = (pFVar2->vPairs).nCap;
  if ((long)iVar9 < 1000) {
    pVVar6 = (pFVar2->vPairs).pArray;
    if (pVVar6 == (Vec_Int_t *)0x0) {
      pVVar6 = (Vec_Int_t *)malloc(16000);
    }
    else {
      pVVar6 = (Vec_Int_t *)realloc(pVVar6,16000);
    }
    (pFVar2->vPairs).pArray = pVVar6;
    memset(pVVar6 + iVar9,0,(ulong)(1000 - iVar9) << 4);
    (pFVar2->vPairs).nCap = 1000;
  }
  Vec_WecPushLevel(&pFVar2->vPairs);
  iVar9 = (pFVar2->vDivs).nCap;
  uVar8 = pFVar2->nVars;
  uVar14 = (long)(int)uVar8 + 1000;
  if (iVar9 < (int)uVar14) {
    pwVar7 = (pFVar2->vDivs).pArray;
    if (pwVar7 == (word *)0x0) {
      pwVar7 = (word *)malloc(uVar14 * 8);
    }
    else {
      pwVar7 = (word *)realloc(pwVar7,uVar14 * 8);
    }
    (pFVar2->vDivs).pArray = pwVar7;
  }
  else {
    if ((int)uVar8 <= iVar9) goto LAB_00358eae;
    pwVar7 = (pFVar2->vDivs).pArray;
    sVar11 = (long)(int)uVar8 << 3;
    if (pwVar7 == (word *)0x0) {
      pwVar7 = (word *)malloc(sVar11);
    }
    else {
      pwVar7 = (word *)realloc(pwVar7,sVar11);
    }
    (pFVar2->vDivs).pArray = pwVar7;
    uVar14 = (ulong)uVar8;
  }
  if (pwVar7 == (word *)0x0) {
    __assert_fail("p->pArray",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                  ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
  }
  (pFVar2->vDivs).nCap = (int)uVar14;
LAB_00358eae:
  if (0 < (int)uVar8) {
    memset((pFVar2->vDivs).pArray,0,(ulong)uVar8 * 8);
  }
  (pFVar2->vDivs).nSize = uVar8;
  return pFVar2;
}

Assistant:

Fxch_Man_t * Fxch_ManStart( Vec_Wec_t * vCubes, Vec_Wec_t * vLits )
{
    Vec_Int_t * vCube;  int i, LogSize;
    Fxch_Man_t * p = ABC_CALLOC( Fxch_Man_t, 1 );
    p->vCubes = *vCubes;
    p->vLits  = *vLits;
    p->nVars  = Vec_WecSize(vLits)/2;
    p->nLits  = 0;
    // random numbers
    Gia_ManRandom( 1 );
    Vec_IntGrow( &p->vRands, 2*p->nVars );
    for ( i = 0; i < 2*p->nVars; i++ )
        Vec_IntPush( &p->vRands, Gia_ManRandom(0) & 0x3FFFFFF ); // assert( LogSize <= 26 );
    // create cube links
    Vec_IntGrow( &p->vCubeLinks, Vec_WecSize(&p->vCubes) );
    Vec_WecForEachLevel( vCubes, vCube, i )
    {
        Vec_IntPush( &p->vCubeLinks, p->nLits+1 );
        p->nLits += Vec_IntSize(vCube);
    }
    assert( Vec_IntSize(&p->vCubeLinks) == Vec_WecSize(&p->vCubes) );
    // create table
    LogSize = Abc_Base2Log( p->nLits+1 );
    assert( LogSize <= 26 );
    p->SizeMask = (1 << LogSize) - 1;
    p->pBins = ABC_CALLOC( Fxch_Obj_t, p->SizeMask + 1 );
    assert( p->nLits+1 < p->SizeMask+1 );
    // divisor weights and cube pairs
    Vec_FltGrow( &p->vWeights, 1000 );
    Vec_FltPush( &p->vWeights, -1 );
    Vec_WecGrow( &p->vPairs, 1000 );
    Vec_WecPushLevel( &p->vPairs );
    // prepare divisors
    Vec_WrdGrow( &p->vDivs, p->nVars + 1000 );
    Vec_WrdFill( &p->vDivs, p->nVars, 0 );
    return p;
}